

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

uchar * mg_parse_dns_resource_record(uchar *data,uchar *end,mg_dns_resource_record *rr,int reply)

{
  uchar uVar1;
  uchar uVar2;
  byte *pbVar3;
  mg_dns_resource_record_kind mVar4;
  bool bVar5;
  uint local_3c;
  int data_len;
  int chunk_len;
  uchar *name;
  int reply_local;
  mg_dns_resource_record *rr_local;
  uchar *end_local;
  uchar *data_local;
  
  end_local = data;
  while( true ) {
    bVar5 = false;
    if (end_local < end) {
      local_3c = (uint)*end_local;
      bVar5 = local_3c != 0;
    }
    if (!bVar5) goto LAB_00116cfb;
    if ((*end_local & 0xc0) != 0) break;
    end_local = end_local + (int)(local_3c + 1);
  }
  end_local = end_local + 1;
LAB_00116cfb:
  (rr->name).p = (char *)data;
  (rr->name).len = (size_t)(end_local + (1 - (long)data));
  data_local = end_local + 1;
  if (data_local <= end + -4) {
    rr->rtype = (uint)CONCAT11(*data_local,end_local[2]);
    rr->rclass = (uint)CONCAT11(end_local[3],end_local[4]);
    pbVar3 = end_local + 5;
    mVar4 = MG_DNS_QUESTION;
    if (reply != 0) {
      mVar4 = MG_DNS_ANSWER;
    }
    rr->kind = mVar4;
    if (reply != 0) {
      if (end + -6 <= pbVar3) {
        return pbVar3;
      }
      rr->ttl = (uint)*pbVar3 << 0x18 | (uint)end_local[6] << 0x10 | (uint)end_local[7] << 8 |
                (uint)end_local[8];
      uVar1 = end_local[9];
      uVar2 = end_local[10];
      (rr->rdata).p = (char *)(end_local + 0xb);
      (rr->rdata).len = (long)(int)(uint)CONCAT11(uVar1,uVar2);
      pbVar3 = end_local + 0xb + (int)(uint)CONCAT11(uVar1,uVar2);
    }
    end_local = pbVar3;
    data_local = end_local;
  }
  return data_local;
}

Assistant:

static unsigned char *mg_parse_dns_resource_record(
        unsigned char *data, unsigned char *end, struct mg_dns_resource_record *rr,
        int reply) {
    unsigned char *name = data;
    int chunk_len, data_len;

    while (data < end && (chunk_len = *data)) {
        if (((unsigned char *) data)[0] & 0xc0) {
            data += 1;
            break;
        }
        data += chunk_len + 1;
    }

    rr->name.p = (char *) name;
    rr->name.len = data - name + 1;

    data++;
    if (data > end - 4) {
        return data;
    }

    rr->rtype = data[0] << 8 | data[1];
    data += 2;

    rr->rclass = data[0] << 8 | data[1];
    data += 2;

    rr->kind = reply ? MG_DNS_ANSWER : MG_DNS_QUESTION;
    if (reply) {
        if (data >= end - 6) {
            return data;
        }

        rr->ttl = (uint32_t) data[0] << 24 | (uint32_t) data[1] << 16 |
                  data[2] << 8 | data[3];
        data += 4;

        data_len = *data << 8 | *(data + 1);
        data += 2;

        rr->rdata.p = (char *) data;
        rr->rdata.len = data_len;
        data += data_len;
    }
    return data;
}